

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

void __thiscall helics::FederateState::~FederateState(FederateState *this)

{
  CLI::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&this->tags);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->fedCallbacks).
              super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  ::~vector(&this->queryCallbacks);
  std::_Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::
  ~_Vector_base(&(this->delayedFederates).
                 super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
               );
  std::_Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>::
  ~_Vector_base(&(this->eventMessages).
                 super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>
               );
  std::_Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>::
  ~_Vector_base(&(this->events).
                 super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>
               );
  std::
  _Rb_tree<helics::GlobalFederateId,_std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>,_std::_Select1st<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
  ::~_Rb_tree(&(this->delayQueues)._M_t);
  gmlc::containers::
  BlockingQueue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::mutex,_std::condition_variable>
  ::~BlockingQueue(&this->commandQueue);
  gmlc::containers::BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  ~BlockingQueue(&this->queue);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->mTimer).super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&this->errorString);
  std::unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>::~unique_ptr
            (&this->mLogManager);
  InterfaceInfo::~InterfaceInfo(&this->interfaceInformation);
  std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
  ~unique_ptr(&this->timeCoord);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

FederateState::~FederateState() = default;